

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O1

void magma_key(gost_ctx *c,byte *k)

{
  uint uVar1;
  long lVar2;
  
  RAND_priv_bytes(c->mask,0x20);
  lVar2 = 0;
  do {
    uVar1 = *(uint *)(k + lVar2 * 4);
    c->key[lVar2] =
         (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) -
         c->mask[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return;
}

Assistant:

void magma_key(gost_ctx * c, const byte * k)
{
    int i, j;
    RAND_priv_bytes((unsigned char *)c->mask, sizeof(c->mask));
    for (i = 0, j = 0; i < 8; ++i, j += 4) {
        c->key[i] =
            (k[j + 3] | (k[j + 2] << 8) | (k[j + 1] << 16) | ((word32) k[j] <<
                                                             24))  - c->mask[i];
    }
}